

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ConfigureXmlOutput(UnitTestImpl *this)

{
  bool bVar1;
  XmlUnitTestResultPrinter *this_00;
  String local_38;
  char *local_28;
  
  UnitTestOptions::GetOutputFormat();
  bVar1 = String::operator==(&local_38,"xml");
  if (bVar1) {
    this_00 = (XmlUnitTestResultPrinter *)operator_new(0x18);
    UnitTestOptions::GetAbsolutePathToOutputFile();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(this_00,local_28);
    TestEventListeners::SetDefaultXmlGenerator(&this->listeners_,(TestEventListener *)this_00);
    if (local_28 != (char *)0x0) {
      operator_delete__(local_28);
    }
  }
  else {
    bVar1 = String::operator==(&local_38,"");
    if (!bVar1) {
      printf("WARNING: unrecognized output format \"%s\" ignored.\n",local_38.c_str_);
      fflush(_stdout);
    }
  }
  if (local_38.c_str_ != (char *)0x0) {
    operator_delete__(local_38.c_str_);
  }
  return;
}

Assistant:

void UnitTestImpl::ConfigureXmlOutput() {
  const String& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml") {
    listeners()->SetDefaultXmlGenerator(new XmlUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format != "") {
    printf("WARNING: unrecognized output format \"%s\" ignored.\n",
           output_format.c_str());
    fflush(stdout);
  }
}